

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O1

int __thiscall P_Assertion::match(P_Assertion *this,vector<StateP,_std::allocator<StateP>_> *stk)

{
  int *piVar1;
  bool bVar2;
  pointer pSVar3;
  uint uVar4;
  State local_80;
  
  pSVar3 = (stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  Grid::Grid(&local_80.cg,(Grid *)(pSVar3 + -1));
  local_80.flags = pSVar3[-1].st.flags;
  local_80.direction = pSVar3[-1].st.direction;
  local_80.position = pSVar3[-1].st.position;
  std::vector<int,_std::allocator<int>_>::vector(&local_80.qcount,&pSVar3[-1].st.qcount);
  uVar4 = ::match(&local_80,this->pattern,false);
  bVar2 = this->value;
  if (local_80.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.qcount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Grid::~Grid(&local_80.cg);
  if (uVar4 == bVar2) {
    piVar1 = &(stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
              super__Vector_impl_data._M_finish[-1].iseq;
    *piVar1 = *piVar1 + 1;
  }
  else {
    std::vector<StateP,_std::allocator<StateP>_>::pop_back(stk);
  }
  return 0;
}

Assistant:

int P_Assertion::match(vector<StateP> &stk) {
    if ((int) ::match(stk.back().st, pattern) == (int) value) {
        stk.back().iseq++;
    } else {
        stk.pop_back();
    }
    return 0;
}